

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O2

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,path *name,
          array<irr::video::IImage_*> *images,E_TEXTURE_TYPE type,COpenGLDriver *driver)

{
  array<irr::video::IImage_*> *this_00;
  dimension2d<unsigned_int> dVar1;
  dimension2d<unsigned_int> dVar2;
  long *plVar3;
  IImage *pIVar4;
  long lVar5;
  ITexture *texture;
  bool bVar6;
  char cVar7;
  E_DRIVER_TYPE EVar8;
  GLenum GVar9;
  IImage *pIVar10;
  void *pvVar11;
  pointer ppIVar12;
  pointer ppIVar13;
  u32 i;
  ulong uVar14;
  u32 i_3;
  array<irr::video::IImage_*> *paVar15;
  u32 i_1;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  undefined8 local_38;
  
  *(undefined ***)&this->field_0xf0 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(undefined4 *)&this->field_0x100 = 1;
  ITexture::ITexture(&this->super_ITexture,&PTR_construction_vtable_24__00281fe8,name,type);
  (this->super_ITexture)._vptr_ITexture = (_func_int **)0x281f90;
  *(undefined8 *)&this->field_0xf0 = 0x281fd0;
  *(COpenGLDriver **)&(this->super_ITexture).field_0x78 = driver;
  *(undefined8 *)&(this->super_ITexture).field_0x80 = 0xde1;
  *(undefined8 *)&(this->super_ITexture).field_0x88 = 0x190800001908;
  this->PixelType = 0x1401;
  this->Converter = (_func_void_void_ptr_s32_void_ptr *)0x0;
  this->LockReadOnly = false;
  this->LockImage = (IImage *)0x0;
  this->LockLayer = 0;
  this->KeepImage = false;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Images).is_sorted = true;
  this->MipLevelStored = '\0';
  this->LegacyAutoGenerateMipMaps = false;
  (this->StatesCache).WrapU = '\0';
  (this->StatesCache).WrapV = '\0';
  (this->StatesCache).WrapW = '\0';
  (this->StatesCache).LODBias = '\0';
  (this->StatesCache).AnisotropicFilter = '\0';
  (this->StatesCache).MinFilter = ETMINF_NEAREST_MIPMAP_NEAREST;
  (this->StatesCache).MagFilter = ETMAGF_NEAREST;
  (this->StatesCache).MipMapStatus = false;
  (this->StatesCache).IsCached = false;
  EVar8 = (*(driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x54])(driver);
  (this->super_ITexture).DriverType = EVar8;
  GVar9 = TextureTypeIrrToGL(this,(this->super_ITexture).Type);
  *(GLenum *)&(this->super_ITexture).field_0x80 = GVar9;
  plVar3 = *(long **)&(this->super_ITexture).field_0x78;
  bVar6 = (bool)(**(code **)(*plVar3 + 0x220))(plVar3,0x10);
  (this->super_ITexture).HasMipMaps = bVar6;
  plVar3 = *(long **)&(this->super_ITexture).field_0x78;
  bVar6 = (bool)(**(code **)(*plVar3 + 0x220))(plVar3,0x80);
  this->KeepImage = bVar6;
  getImageValues(this,*(images->m_data).
                       super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  if (*(int *)&(this->super_ITexture).field_0x88 != 0) {
    this_00 = &this->Images;
    if ((((this->KeepImage != false) ||
         ((this->super_ITexture).OriginalSize.Width != (this->super_ITexture).Size.Width)) ||
        ((this->super_ITexture).OriginalSize.Height != (this->super_ITexture).Size.Height)) ||
       (paVar15 = images,
       (this->super_ITexture).OriginalColorFormat != (this->super_ITexture).ColorFormat)) {
      std::vector<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>::resize
                (&this_00->m_data,
                 (ulong)((long)(images->m_data).
                               super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(images->m_data).
                              super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
      for (uVar14 = 0; paVar15 = this_00,
          uVar14 < ((ulong)((long)(images->m_data).
                                  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(images->m_data).
                                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
          uVar14 = uVar14 + 1) {
        plVar3 = *(long **)&(this->super_ITexture).field_0x78;
        pIVar10 = (IImage *)
                  (**(code **)(*plVar3 + 0x250))
                            (plVar3,(this->super_ITexture).ColorFormat,&(this->super_ITexture).Size)
        ;
        ppIVar12 = (this->Images).m_data.
                   super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar12[uVar14] = pIVar10;
        pIVar10 = (images->m_data).
                  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar14];
        dVar1 = (this->super_ITexture).Size;
        iVar18 = -(uint)(dVar1.Width == (pIVar10->Size).Width);
        iVar19 = -(uint)(dVar1.Height == (pIVar10->Size).Height);
        auVar16._4_4_ = iVar18;
        auVar16._0_4_ = iVar18;
        auVar16._8_4_ = iVar19;
        auVar16._12_4_ = iVar19;
        iVar18 = movmskpd((int)ppIVar12,auVar16);
        pIVar4 = (this->Images).m_data.
                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar14];
        if (iVar18 == 3) {
          local_38 = 0;
          (*pIVar10->_vptr_IImage[7])(pIVar10,pIVar4,&local_38);
        }
        else {
          (*pIVar10->_vptr_IImage[6])(pIVar10,pIVar4);
        }
        pvVar11 = IImage::getMipMapsData
                            ((images->m_data).
                             super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar14],1);
        if (pvVar11 != (void *)0x0) {
          dVar1 = (this->super_ITexture).OriginalSize;
          dVar2 = (this->super_ITexture).Size;
          iVar18 = -(uint)(dVar2.Width == dVar1.Width);
          iVar19 = -(uint)(dVar2.Height == dVar1.Height);
          auVar17._0_8_ = (double)CONCAT44(iVar18,iVar18);
          auVar17._8_4_ = iVar19;
          auVar17._12_4_ = iVar19;
          iVar18 = movmskpd((int)pvVar11,auVar17);
          if ((iVar18 == 3) &&
             ((this->super_ITexture).OriginalColorFormat == (this->super_ITexture).ColorFormat)) {
            pIVar10 = (this_00->m_data).
                      super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14];
            pvVar11 = IImage::getMipMapsData
                                ((images->m_data).
                                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar14],1);
            IImage::setMipMapsData(pIVar10,pvVar11,false);
          }
          else {
            os::Printer::log((Printer *)
                             "COpenGLCoreTexture: Can\'t handle format changes for mipmap data. Mipmap data dropped"
                             ,auVar17._0_8_);
          }
        }
      }
    }
    (*GL.GenTextures)(1,(GLuint *)&(this->super_ITexture).field_0x84);
    lVar5 = *(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8);
    texture = *(ITexture **)(lVar5 + 0x20);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::set((STextureCache *)(lVar5 + 0x10),0,&this->super_ITexture,EST_ACTIVE_ALWAYS);
    (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x2801,0x2600);
    (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x2800,0x2600);
    if ((this->super_ITexture).HasMipMaps == true) {
      plVar3 = *(long **)&(this->super_ITexture).field_0x78;
      cVar7 = (**(code **)(*plVar3 + 0x220))(plVar3,8);
      if (cVar7 == '\0') {
        plVar3 = *(long **)&(this->super_ITexture).field_0x78;
        cVar7 = (**(code **)(*plVar3 + 0x220))(plVar3,4);
        if (cVar7 == '\0') {
          GVar9 = 0x1100;
        }
        else {
          GVar9 = 0x1102;
        }
        (*GL.Hint)(0x8192,GVar9);
      }
      else {
        (*GL.Hint)(0x8192,0x1101);
      }
    }
    uVar14 = 0;
    while( true ) {
      ppIVar12 = (paVar15->m_data).
                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppIVar13 = (paVar15->m_data).
                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (((ulong)((long)ppIVar13 - (long)ppIVar12) >> 3 & 0xffffffff) <= uVar14) break;
      uploadTexture(this,true,(u32)uVar14,0,ppIVar12[uVar14]->Data);
      uVar14 = uVar14 + 1;
    }
    if (((this->super_ITexture).HasMipMaps != false) && (this->LegacyAutoGenerateMipMaps == false))
    {
      for (uVar14 = 0; uVar14 < ((ulong)((long)ppIVar13 - (long)ppIVar12) >> 3 & 0xffffffff);
          uVar14 = uVar14 + 1) {
        pvVar11 = IImage::getMipMapsData(ppIVar12[uVar14],1);
        (*(this->super_ITexture)._vptr_ITexture[2])(this,pvVar11,uVar14 & 0xffffffff);
        ppIVar12 = (paVar15->m_data).
                   super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar13 = (paVar15->m_data).
                   super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if (this->KeepImage == false) {
      for (uVar14 = 0;
          ppIVar12 = (this->Images).m_data.
                     super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          uVar14 < ((ulong)((long)(this->Images).m_data.
                                  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar12) >> 3
                   & 0xffffffff); uVar14 = uVar14 + 1) {
        pIVar10 = ppIVar12[uVar14];
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   ((long)&pIVar10->_vptr_IImage + (long)pIVar10->_vptr_IImage[0xfffffffffffffffd]))
        ;
      }
      core::array<irr::video::IImage_*>::clear(this_00);
    }
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::set
              ((STextureCache *)
               (*(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8) + 0x10),0,texture,
               EST_ACTIVE_ALWAYS);
  }
  return;
}

Assistant:

COpenGLCoreTexture(const io::path &name, const core::array<IImage *> &images, E_TEXTURE_TYPE type, TOpenGLDriver *driver) :
			ITexture(name, type), Driver(driver), TextureType(GL_TEXTURE_2D),
			TextureName(0), InternalFormat(GL_RGBA), PixelFormat(GL_RGBA), PixelType(GL_UNSIGNED_BYTE), Converter(0), LockReadOnly(false), LockImage(0), LockLayer(0),
			KeepImage(false), MipLevelStored(0), LegacyAutoGenerateMipMaps(false)
	{
		_IRR_DEBUG_BREAK_IF(images.size() == 0)

		DriverType = Driver->getDriverType();
		TextureType = TextureTypeIrrToGL(Type);
		HasMipMaps = Driver->getTextureCreationFlag(ETCF_CREATE_MIP_MAPS);
		KeepImage = Driver->getTextureCreationFlag(ETCF_ALLOW_MEMORY_COPY);

		getImageValues(images[0]);
		if (!InternalFormat)
			return;

		const core::array<IImage *> *tmpImages = &images;

		if (KeepImage || OriginalSize != Size || OriginalColorFormat != ColorFormat) {
			Images.set_used(images.size());

			for (u32 i = 0; i < images.size(); ++i) {
				Images[i] = Driver->createImage(ColorFormat, Size);

				if (images[i]->getDimension() == Size)
					images[i]->copyTo(Images[i]);
				else
					images[i]->copyToScaling(Images[i]);

				if (images[i]->getMipMapsData()) {
					if (OriginalSize == Size && OriginalColorFormat == ColorFormat) {
						Images[i]->setMipMapsData(images[i]->getMipMapsData(), false);
					} else {
						// TODO: handle at least mipmap with changing color format
						os::Printer::log("COpenGLCoreTexture: Can't handle format changes for mipmap data. Mipmap data dropped", ELL_WARNING);
					}
				}
			}

			tmpImages = &Images;
		}

		GL.GenTextures(1, &TextureName);

		const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
		Driver->getCacheHandler()->getTextureCache().set(0, this);

		GL.TexParameteri(TextureType, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

#ifdef GL_GENERATE_MIPMAP_HINT
		if (HasMipMaps) {
			if (Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_SPEED))
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_FASTEST);
			else if (Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_QUALITY))
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_NICEST);
			else
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_DONT_CARE);
		}
#endif

		for (u32 i = 0; i < (*tmpImages).size(); ++i)
			uploadTexture(true, i, 0, (*tmpImages)[i]->getData());

		if (HasMipMaps && !LegacyAutoGenerateMipMaps) {
			// Create mipmaps (either from image mipmaps or generate them)
			for (u32 i = 0; i < (*tmpImages).size(); ++i) {
				void *mipmapsData = (*tmpImages)[i]->getMipMapsData();
				regenerateMipMapLevels(mipmapsData, i);
			}
		}

		if (!KeepImage) {
			for (u32 i = 0; i < Images.size(); ++i)
				Images[i]->drop();

			Images.clear();
		}

		Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);

		Driver->testGLError(__LINE__);
	}